

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImU32 ImGui::ColorConvertFloat4ToU32(ImVec4 *in)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = in->x;
  fVar2 = in->y;
  fVar6 = 1.0;
  if (fVar1 <= 1.0) {
    fVar6 = fVar1;
  }
  fVar7 = 1.0;
  if (fVar2 <= 1.0) {
    fVar7 = fVar2;
  }
  fVar3 = in->z;
  fVar8 = 1.0;
  if (fVar3 <= 1.0) {
    fVar8 = fVar3;
  }
  fVar4 = in->w;
  fVar5 = 1.0;
  if (fVar4 <= 1.0) {
    fVar5 = fVar4;
  }
  return (int)((float)(~-(uint)(fVar4 < 0.0) & (uint)fVar5) * 255.0 + 0.5) << 0x18 |
         (int)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar8) * 255.0 + 0.5) << 0x10 |
         (int)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar7) * 255.0 + 0.5) << 8 |
         (int)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar6) * 255.0 + 0.5);
}

Assistant:

ImU32 ImGui::ColorConvertFloat4ToU32(const ImVec4& in)
{
    ImU32 out;
    out  = ((ImU32)IM_F32_TO_INT8_SAT(in.x)) << IM_COL32_R_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.y)) << IM_COL32_G_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.z)) << IM_COL32_B_SHIFT;
    out |= ((ImU32)IM_F32_TO_INT8_SAT(in.w)) << IM_COL32_A_SHIFT;
    return out;
}